

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O1

AspifTextOutput * __thiscall Potassco::AspifTextOutput::push(AspifTextOutput *this,LitSpan *lits)

{
  uint uVar1;
  Data *this_00;
  iterator __position;
  undefined4 in_EAX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar2;
  
  this_00 = this->data_;
  uVar1 = (uint)lits->size;
  uVar2 = CONCAT44(uVar1,in_EAX);
  __position._M_current =
       (this_00->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this_00->directives,__position,(uint *)&stack0xffffffffffffffec);
  }
  else {
    *__position._M_current = uVar1;
    (this_00->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_insert<int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this->data_,
             (this->data_->directives).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish,lits->first,lits->first + lits->size,in_R8,in_R9,
             uVar2);
  return this;
}

Assistant:

AspifTextOutput& AspifTextOutput::push(const LitSpan& lits) {
	data_->directives.push_back(static_cast<uint32_t>(size(lits)));
	data_->directives.insert(data_->directives.end(), begin(lits), end(lits));
	return *this;
}